

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_os_mkdir(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  char *__path;
  int *piVar3;
  int64_t iVar4;
  JSValueUnion JVar5;
  JSValue JVar6;
  int mode;
  undefined8 uStack_28;
  
  if (argc < 2) {
    uStack_28 = CONCAT44(0x1ff,(int)in_RAX);
  }
  else {
    uStack_28 = in_RAX;
    iVar1 = JS_ToInt32(ctx,(int32_t *)((long)&uStack_28 + 4),argv[1]);
    if (iVar1 != 0) {
      iVar4 = 6;
      JVar5.float64 = 0.0;
      goto LAB_0011312d;
    }
  }
  JVar5.float64 = 0.0;
  __path = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  if (__path == (char *)0x0) {
    iVar4 = 6;
  }
  else {
    uVar2 = mkdir(__path,uStack_28._4_4_);
    if (uVar2 == 0xffffffff) {
      piVar3 = __errno_location();
      uVar2 = -*piVar3;
    }
    JS_FreeCString(ctx,__path);
    JVar5._4_4_ = 0;
    JVar5.int32 = uVar2;
    iVar4 = 0;
  }
LAB_0011312d:
  JVar6.tag = iVar4;
  JVar6.u.float64 = JVar5.float64;
  return JVar6;
}

Assistant:

static JSValue js_os_mkdir(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    int mode, ret;
    const char *path;
    
    if (argc >= 2) {
        if (JS_ToInt32(ctx, &mode, argv[1]))
            return JS_EXCEPTION;
    } else {
        mode = 0777;
    }
    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
#if defined(_WIN32)
    (void)mode;
    ret = js_get_errno(mkdir(path));
#else
    ret = js_get_errno(mkdir(path, mode));
#endif
    JS_FreeCString(ctx, path);
    return JS_NewInt32(ctx, ret);
}